

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_widget_layout_states nk_widget(nk_rect *bounds,nk_context *ctx)

{
  float fVar1;
  uint uVar2;
  nk_panel *pnVar3;
  float fVar4;
  nk_widget_layout_states nVar5;
  float x0;
  float y0;
  float fVar6;
  float fVar7;
  int iVar8;
  int iVar9;
  nk_rect v;
  nk_rect local_28;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4ac8,
                  "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4ac9,
                  "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4aca,
                  "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                 );
  }
  nk_panel_alloc_space(bounds,ctx);
  pnVar3 = ctx->current->layout;
  local_28.x = (pnVar3->clip).x;
  local_28.y = (pnVar3->clip).y;
  local_28.w = (pnVar3->clip).w;
  local_28.h = (pnVar3->clip).h;
  uVar2 = pnVar3->flags;
  if (-1 < (short)uVar2) {
    if ((uVar2 >> 0xd & 1) != 0) {
      __assert_fail("!(layout->flags & NK_WINDOW_HIDDEN)",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x4adb,
                    "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                   );
    }
    if ((uVar2 >> 0xe & 1) == 0) {
      fVar1 = bounds->w;
      fVar4 = bounds->h;
      x0 = (float)(int)bounds->x;
      y0 = (float)(int)bounds->y;
      bounds->x = x0;
      bounds->y = y0;
      bounds->w = (float)(int)fVar1;
      bounds->h = (float)(int)fVar4;
      iVar8 = (int)local_28.w;
      iVar9 = (int)local_28.h;
      fVar6 = (float)(int)local_28.x;
      fVar7 = (float)(int)local_28.y;
      local_28.y = fVar7;
      local_28.x = fVar6;
      local_28.h = (float)iVar9;
      local_28.w = (float)iVar8;
      nk_unify(&v,&local_28,x0,y0,(float)(int)fVar1 + x0,(float)(int)fVar4 + y0);
      nVar5 = NK_WIDGET_INVALID;
      if ((((bounds->x <= (float)iVar8 + fVar6) && (fVar6 <= bounds->x + bounds->w)) &&
          (bounds->y <= (float)iVar9 + fVar7)) && (fVar7 <= bounds->y + bounds->h)) {
        fVar1 = (ctx->input).mouse.pos.x;
        nVar5 = NK_WIDGET_ROM;
        if ((v.x <= fVar1) && (fVar1 < v.x + v.w)) {
          fVar1 = (ctx->input).mouse.pos.y;
          if ((v.y <= fVar1) && (fVar1 < v.y + v.h)) {
            nVar5 = NK_WIDGET_VALID;
          }
        }
      }
      return nVar5;
    }
    __assert_fail("!(layout->flags & NK_WINDOW_CLOSED)",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4adc,
                  "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                 );
  }
  __assert_fail("!(layout->flags & NK_WINDOW_MINIMIZED)",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x4ada,
                "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
               );
}

Assistant:

NK_API enum nk_widget_layout_states
nk_widget(struct nk_rect *bounds, const struct nk_context *ctx)
{
    struct nk_rect c, v;
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return NK_WIDGET_INVALID;

    /* allocate space and check if the widget needs to be updated and drawn */
    nk_panel_alloc_space(bounds, ctx);
    win = ctx->current;
    layout = win->layout;
    in = &ctx->input;
    c = layout->clip;

    /*  if one of these triggers you forgot to add an `if` condition around either
        a window, group, popup, combobox or contextual menu `begin` and `end` block.
        Example:
            if (nk_begin(...) {...} nk_end(...); or
            if (nk_group_begin(...) { nk_group_end(...);} */
    NK_ASSERT(!(layout->flags & NK_WINDOW_MINIMIZED));
    NK_ASSERT(!(layout->flags & NK_WINDOW_HIDDEN));
    NK_ASSERT(!(layout->flags & NK_WINDOW_CLOSED));

    /* need to convert to int here to remove floating point errors */
    bounds->x = (float)((int)bounds->x);
    bounds->y = (float)((int)bounds->y);
    bounds->w = (float)((int)bounds->w);
    bounds->h = (float)((int)bounds->h);

    c.x = (float)((int)c.x);
    c.y = (float)((int)c.y);
    c.w = (float)((int)c.w);
    c.h = (float)((int)c.h);

    nk_unify(&v, &c, bounds->x, bounds->y, bounds->x + bounds->w, bounds->y + bounds->h);
    if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds->x, bounds->y, bounds->w, bounds->h))
        return NK_WIDGET_INVALID;
    if (!NK_INBOX(in->mouse.pos.x, in->mouse.pos.y, v.x, v.y, v.w, v.h))
        return NK_WIDGET_ROM;
    return NK_WIDGET_VALID;
}